

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_system.cpp
# Opt level: O1

unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true> __thiscall
duckdb::FileSystem::OpenFileExtended
          (FileSystem *this,OpenFileInfo *path,FileOpenFlags flags,
          optional_ptr<duckdb::FileOpener,_true> opener)

{
  NotImplementedException *this_00;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  this_00 = (NotImplementedException *)__cxa_allocate_exception(0x10,path,flags.flags,flags._8_8_);
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_60,"%s: OpenFileExtended is not implemented!","");
  (**(code **)((path->path)._M_dataplus._M_p + 0x138))(&local_40,path);
  NotImplementedException::NotImplementedException<std::__cxx11::string>
            (this_00,&local_60,&local_40);
  __cxa_throw(this_00,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

unique_ptr<FileHandle> FileSystem::OpenFileExtended(const OpenFileInfo &path, FileOpenFlags flags,
                                                    optional_ptr<FileOpener> opener) {
	// for backwards compatibility purposes - default to OpenFile
	throw NotImplementedException("%s: OpenFileExtended is not implemented!", GetName());
}